

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool __thiscall libcellml::Units::setUnitId(Units *this,size_t index,string *id)

{
  UnitsImpl *pUVar1;
  size_type sVar2;
  reference pvVar3;
  string *id_local;
  size_t index_local;
  Units *this_local;
  
  pUVar1 = pFunc(this);
  sVar2 = std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::size
                    (&pUVar1->mUnitDefinitions);
  if (index < sVar2) {
    pUVar1 = pFunc(this);
    pvVar3 = std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::
             operator[](&pUVar1->mUnitDefinitions,index);
    std::__cxx11::string::operator=((string *)&pvVar3->mId,(string *)id);
  }
  return index < sVar2;
}

Assistant:

bool Units::setUnitId(size_t index, const std::string &id)
{
    if (index < pFunc()->mUnitDefinitions.size()) {
        pFunc()->mUnitDefinitions[index].mId = id;
        return true;
    }
    return false;
}